

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O2

void __thiscall indigox::Atom::RemoveBond(Atom *this,Bond_p *b)

{
  element_type *peVar1;
  element_type *peVar2;
  const_iterator cVar3;
  const_iterator __position;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __position._M_current =
       (this->bonds_).
       super__Vector_base<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    cVar3._M_current = __position._M_current;
    if (__position._M_current ==
        (this->bonds_).
        super__Vector_base<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00108de5:
      if (__position._M_current != cVar3._M_current) {
        std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>::
        erase(&this->bonds_,__position);
      }
      return;
    }
    std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,__position._M_current);
    peVar2 = local_40._M_ptr;
    peVar1 = (b->super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if (peVar2 == peVar1) {
      cVar3._M_current =
           (this->bonds_).
           super__Vector_base<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00108de5;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void Atom::RemoveBond(Bond_p b) {
    AtomBondIterator it = bonds_.begin();
    for (; it != bonds_.end(); ++it) {
      if (it->lock() == b) break;
    }
    if (it != bonds_.end()) bonds_.erase(it);
  }